

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<const_void_*,_QCss::StyleSheet>_>::Data
          (Data<QHashPrivate::Node<const_void_*,_QCss::StyleSheet>_> *this,
          Data<QHashPrivate::Node<const_void_*,_QCss::StyleSheet>_> *other)

{
  Span *pSVar1;
  Entry *pEVar2;
  Data *pDVar3;
  Data *pDVar4;
  Data *pDVar5;
  Data *pDVar6;
  Data *pDVar7;
  undefined8 uVar8;
  Data *pDVar9;
  ulong uVar10;
  Node<const_void_*,_QCss::StyleSheet> *pNVar11;
  long lVar12;
  size_t sVar13;
  size_t sVar14;
  R RVar15;
  
  (this->ref).atomic._q_value.super___atomic_base<int>._M_i = 1;
  this->size = other->size;
  sVar13 = other->numBuckets;
  sVar14 = other->seed;
  this->numBuckets = other->numBuckets;
  this->seed = sVar14;
  this->spans = (Span *)0x0;
  RVar15 = allocateSpans(sVar13);
  this->spans = (Span *)RVar15.spans;
  if (RVar15.nSpans != 0) {
    lVar12 = 0;
    sVar13 = 0;
    do {
      pSVar1 = other->spans;
      sVar14 = 0;
      do {
        uVar10 = (ulong)pSVar1->offsets[sVar14 + lVar12];
        if (uVar10 != 0xff) {
          pEVar2 = pSVar1[sVar13].entries;
          pNVar11 = Span<QHashPrivate::Node<const_void_*,_QCss::StyleSheet>_>::insert
                              (this->spans + sVar13,sVar14);
          pNVar11->key = *(void **)pEVar2[uVar10].storage.data;
          pDVar3 = *(Data **)(pEVar2[uVar10].storage.data + 8);
          (pNVar11->value).styleRules.d.d = pDVar3;
          (pNVar11->value).styleRules.d.ptr = *(StyleRule **)(pEVar2[uVar10].storage.data + 0x10);
          (pNVar11->value).styleRules.d.size = *(qsizetype *)(pEVar2[uVar10].storage.data + 0x18);
          if (pDVar3 != (Data *)0x0) {
            LOCK();
            (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> =
                 (__atomic_base<int>)
                 ((__int_type)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1)
            ;
            UNLOCK();
          }
          pDVar4 = *(Data **)(pEVar2[uVar10].storage.data + 0x20);
          (pNVar11->value).mediaRules.d.d = pDVar4;
          (pNVar11->value).mediaRules.d.ptr = *(MediaRule **)(pEVar2[uVar10].storage.data + 0x28);
          (pNVar11->value).mediaRules.d.size = *(qsizetype *)(pEVar2[uVar10].storage.data + 0x30);
          if (pDVar4 != (Data *)0x0) {
            LOCK();
            (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          pDVar5 = *(Data **)(pEVar2[uVar10].storage.data + 0x38);
          (pNVar11->value).pageRules.d.d = pDVar5;
          (pNVar11->value).pageRules.d.ptr = *(PageRule **)(pEVar2[uVar10].storage.data + 0x40);
          (pNVar11->value).pageRules.d.size = *(qsizetype *)(pEVar2[uVar10].storage.data + 0x48);
          if (pDVar5 != (Data *)0x0) {
            LOCK();
            (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          pDVar6 = *(Data **)(pEVar2[uVar10].storage.data + 0x50);
          (pNVar11->value).animationRules.d.d = pDVar6;
          (pNVar11->value).animationRules.d.ptr =
               *(AnimationRule **)(pEVar2[uVar10].storage.data + 0x58);
          (pNVar11->value).animationRules.d.size =
               *(qsizetype *)(pEVar2[uVar10].storage.data + 0x60);
          if (pDVar6 != (Data *)0x0) {
            LOCK();
            (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          pDVar7 = *(Data **)(pEVar2[uVar10].storage.data + 0x68);
          (pNVar11->value).importRules.d.d = pDVar7;
          (pNVar11->value).importRules.d.ptr = *(ImportRule **)(pEVar2[uVar10].storage.data + 0x70);
          (pNVar11->value).importRules.d.size = *(qsizetype *)(pEVar2[uVar10].storage.data + 0x78);
          if (pDVar7 != (Data *)0x0) {
            LOCK();
            (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          uVar8 = *(undefined8 *)(pEVar2[uVar10].storage.data + 0x80);
          (pNVar11->value).origin = (int)uVar8;
          (pNVar11->value).depth = (int)((ulong)uVar8 >> 0x20);
          pDVar9 = *(Data **)(pEVar2[uVar10].storage.data + 0x88);
          (pNVar11->value).nameIndex.d = pDVar9;
          (pNVar11->value).nameIndex.m_size = *(qsizetype *)(pEVar2[uVar10].storage.data + 0x90);
          if ((pDVar9 != (Data *)0x0) && (*(int *)pDVar9 != -1)) {
            LOCK();
            *(int *)pDVar9 = *(int *)pDVar9 + 1;
            UNLOCK();
          }
          pDVar9 = *(Data **)(pEVar2[uVar10].storage.data + 0x98);
          (pNVar11->value).idIndex.d = pDVar9;
          (pNVar11->value).idIndex.m_size = *(qsizetype *)(pEVar2[uVar10].storage.data + 0xa0);
          if ((pDVar9 != (Data *)0x0) && (*(int *)pDVar9 != -1)) {
            LOCK();
            *(int *)pDVar9 = *(int *)pDVar9 + 1;
            UNLOCK();
          }
        }
        sVar14 = sVar14 + 1;
      } while (sVar14 != 0x80);
      sVar13 = sVar13 + 1;
      lVar12 = lVar12 + 0x90;
    } while (sVar13 != RVar15.nSpans);
  }
  return;
}

Assistant:

Data(const Data &other) : size(other.size), numBuckets(other.numBuckets), seed(other.seed)
    {
        auto r = allocateSpans(numBuckets);
        spans = r.spans;
        reallocationHelper<false>(other, r.nSpans);
    }